

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

Token __thiscall czh::lexer::NumberMatch::get_token(NumberMatch *this,int ch)

{
  int iVar1;
  int ch_local;
  NumberMatch *this_local;
  
  iVar1 = isdigit(ch);
  if (iVar1 == 0) {
    if (ch == 0x2e) {
      this->_is_double = true;
      this_local._4_4_ = DOT;
    }
    else if ((ch == 0x65) || (ch == 0x45)) {
      this_local._4_4_ = EXP;
    }
    else if ((ch == 0x2b) || (ch == 0x2d)) {
      this_local._4_4_ = SIGN;
    }
    else if (ch == -1) {
      this_local._4_4_ = END;
    }
    else {
      this_local._4_4_ = UNEXPECTED;
    }
  }
  else {
    this_local._4_4_ = INT;
  }
  return this_local._4_4_;
}

Assistant:

Token get_token(int ch = -1)
    {
      if (std::isdigit(ch))
        return Token::INT;
      else if (ch == '.')
      {
        _is_double = true;
        return Token::DOT;
      }
      else if (ch == 'e' || ch == 'E')
        return Token::EXP;
      else if (ch == '+' || ch == '-')
        return Token::SIGN;
      else if (ch == -1)
        return Token::END;
      return Token::UNEXPECTED;
    }